

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

CoatedConductorBxDF * __thiscall
pbrt::CoatedConductorMaterial::GetBxDF<pbrt::UniversalTextureEvaluator>
          (void *param_1,long param_2,undefined1 (*param_3) [64],undefined8 *param_4)

{
  DielectricBxDF DVar1;
  ConductorBxDF CVar2;
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  TextureEvalContext ctx_03;
  TextureEvalContext ctx_04;
  SampledSpectrum eta;
  TextureEvalContext ctx_05;
  TextureEvalContext ctx_06;
  TextureEvalContext ctx_07;
  TextureEvalContext ctx_08;
  SampledWavelengths lambda;
  SampledWavelengths lambda_00;
  SampledWavelengths lambda_01;
  SampledWavelengths lambda_02;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  bool bVar15;
  long lVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  Float FVar20;
  undefined1 auVar33 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar46 [56];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  SampledSpectrum SVar47;
  Float gg;
  SampledSpectrum a;
  TrowbridgeReitzDistribution conductorDistrib;
  Float cvrough;
  Float curough;
  SampledSpectrum r;
  SampledSpectrum ck;
  SampledSpectrum ce;
  Float ieta;
  Float thick;
  TrowbridgeReitzDistribution interfaceDistrib;
  Float ivrough;
  Float iurough;
  undefined4 in_stack_fffffffffffff928;
  undefined4 uVar48;
  int iVar49;
  undefined4 in_stack_fffffffffffff92c;
  undefined4 uVar50;
  int iVar51;
  undefined4 in_stack_fffffffffffff930;
  undefined4 uVar52;
  undefined4 in_stack_fffffffffffff934;
  undefined4 uVar53;
  Float FVar54;
  Float FVar55;
  TrowbridgeReitzDistribution *pTVar56;
  SampledSpectrum *s;
  undefined4 in_stack_fffffffffffff974;
  CoatedConductorBxDF *this;
  undefined1 *puVar57;
  Float FVar58;
  undefined4 in_stack_fffffffffffff9b0;
  int high;
  TrowbridgeReitzDistribution *mfDistrib;
  undefined1 *in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  UniversalTextureEvaluator *in_stack_fffffffffffff9d0;
  undefined1 *in_stack_fffffffffffff9e0;
  undefined1 *in_stack_fffffffffffff9e8;
  undefined1 *in_stack_fffffffffffff9f0;
  undefined8 in_stack_fffffffffffff9f8;
  CoatedConductorBxDF *pCVar59;
  SpectrumTexture *in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  int in_stack_fffffffffffffa28;
  undefined8 in_stack_fffffffffffffa40;
  TrowbridgeReitzDistribution in_stack_fffffffffffffa48;
  undefined8 in_stack_fffffffffffffa50;
  undefined8 in_stack_fffffffffffffa58;
  undefined8 in_stack_fffffffffffffa60;
  undefined8 in_stack_fffffffffffffa68;
  undefined8 in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  undefined8 in_stack_fffffffffffffa7c;
  Float in_stack_fffffffffffffa84;
  int in_stack_fffffffffffffa88;
  float in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa94 [28];
  undefined1 auVar60 [16];
  undefined1 auStack_538 [12];
  undefined1 local_4ec [52];
  undefined1 auStack_4b8 [12];
  undefined1 local_4a8 [8];
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  TrowbridgeReitzDistribution local_480;
  undefined1 local_478 [12];
  undefined1 auStack_46c [52];
  undefined1 auStack_438 [12];
  Float local_41c;
  undefined1 local_418 [12];
  undefined1 auStack_40c [52];
  undefined1 auStack_3d8 [12];
  Float local_3bc;
  UniversalTextureEvaluator local_3b8 [16];
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 local_348;
  ulong uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  undefined1 auStack_318 [12];
  undefined1 local_30c [52];
  undefined1 auStack_2d8 [12];
  undefined1 local_2c0 [8];
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined1 auStack_278 [12];
  undefined1 local_26c [52];
  undefined1 auStack_238 [12];
  undefined1 local_220 [8];
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined1 auStack_1e8 [12];
  undefined1 local_1dc [52];
  undefined1 auStack_1a8 [12];
  undefined1 local_190 [8];
  undefined8 local_188;
  ulong uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  ulong uStack_160;
  float local_14c;
  undefined1 local_148 [12];
  undefined1 auStack_13c [52];
  undefined1 auStack_108 [12];
  Float local_ec;
  TrowbridgeReitzDistribution local_e8;
  undefined1 local_e0 [12];
  undefined1 auStack_d4 [52];
  undefined1 auStack_a0 [12];
  Float local_84;
  undefined1 local_80 [12];
  undefined1 auStack_74 [52];
  undefined1 auStack_40 [12];
  Float local_24;
  undefined8 *local_20;
  undefined1 (*local_18) [64];
  long local_10;
  undefined1 local_1;
  undefined1 auVar23 [64];
  undefined1 auVar36 [64];
  
  pCVar59 = (CoatedConductorBxDF *)param_1;
  local_20 = param_4;
  local_18 = param_3;
  local_10 = param_2;
  FloatTexture::FloatTexture
            ((FloatTexture *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (FloatTexture *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  memcpy(local_80,local_18,0x4c);
  auVar19._12_52_ = auStack_74;
  auVar19._0_12_ = local_80;
  auVar17 = vmovdqu64_avx512f(auVar19);
  auVar14._52_12_ = auStack_40;
  auVar14._0_52_ = auStack_74;
  auVar18 = vmovdqu64_avx512f(auVar14);
  vmovdqu64_avx512f(auVar18);
  auVar17 = vmovdqu64_avx512f(auVar17);
  uVar48 = auVar17._0_4_;
  uVar50 = auVar17._4_4_;
  uVar52 = auVar17._8_4_;
  uVar53 = auVar17._12_4_;
  ctx._8_8_ = in_stack_fffffffffffff9e8;
  ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffff9e0;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff9f0;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff9f8;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
  ctx._32_8_ = param_1;
  ctx.n.super_Tuple3<pbrt::Normal3,_float>._4_8_ = pCVar59;
  ctx.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)param_2;
  ctx.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)param_2 >> 0x20);
  ctx._56_8_ = in_stack_fffffffffffffa18;
  ctx.dvdx = (Float)in_stack_fffffffffffffa20;
  ctx.dvdy = (Float)in_stack_fffffffffffffa24;
  ctx.faceIndex = in_stack_fffffffffffffa28;
  local_24 = UniversalTextureEvaluator::operator()
                       (in_stack_fffffffffffff9d0,
                        (FloatTexture *)
                        CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),ctx);
  FloatTexture::FloatTexture
            ((FloatTexture *)CONCAT44(uVar53,uVar52),(FloatTexture *)CONCAT44(uVar50,uVar48));
  memcpy(local_e0,local_18,0x4c);
  auVar17._12_52_ = auStack_d4;
  auVar17._0_12_ = local_e0;
  auVar17 = vmovdqu64_avx512f(auVar17);
  auVar18._52_12_ = auStack_a0;
  auVar18._0_52_ = auStack_d4;
  auVar18 = vmovdqu64_avx512f(auVar18);
  vmovdqu64_avx512f(auVar18);
  auVar17 = vmovdqu64_avx512f(auVar17);
  uVar48 = auVar17._0_4_;
  uVar50 = auVar17._4_4_;
  uVar52 = auVar17._8_4_;
  uVar53 = auVar17._12_4_;
  FVar54 = auVar17._16_4_;
  FVar20 = auVar17._20_4_;
  pTVar56 = auVar17._24_8_;
  ctx_00._8_8_ = in_stack_fffffffffffff9e8;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffff9e0;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff9f0;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff9f8;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
  ctx_00._32_8_ = param_1;
  ctx_00.n.super_Tuple3<pbrt::Normal3,_float>._4_8_ = pCVar59;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)param_2;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)param_2 >> 0x20);
  ctx_00._56_8_ = in_stack_fffffffffffffa18;
  ctx_00.dvdx = (Float)in_stack_fffffffffffffa20;
  ctx_00.dvdy = (Float)in_stack_fffffffffffffa24;
  ctx_00.faceIndex = in_stack_fffffffffffffa28;
  local_84 = UniversalTextureEvaluator::operator()
                       (in_stack_fffffffffffff9d0,
                        (FloatTexture *)
                        CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),ctx_00);
  if ((*(byte *)(param_2 + 0x68) & 1) != 0) {
    local_24 = TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
    local_84 = TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
  }
  TrowbridgeReitzDistribution::TrowbridgeReitzDistribution(pTVar56,FVar20,FVar54);
  FloatTexture::FloatTexture
            ((FloatTexture *)CONCAT44(uVar53,uVar52),(FloatTexture *)CONCAT44(uVar50,uVar48));
  memcpy(local_148,local_18,0x4c);
  auVar12._12_52_ = auStack_13c;
  auVar12._0_12_ = local_148;
  auVar17 = vmovdqu64_avx512f(auVar12);
  auVar13._52_12_ = auStack_108;
  auVar13._0_52_ = auStack_13c;
  auVar18 = vmovdqu64_avx512f(auVar13);
  vmovdqu64_avx512f(auVar18);
  auVar17 = vmovdqu64_avx512f(auVar17);
  uVar48 = auVar17._0_4_;
  FVar54 = auVar17._4_4_;
  uVar50 = auVar17._8_4_;
  uVar52 = auVar17._12_4_;
  ctx_01._8_8_ = in_stack_fffffffffffff9e8;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffff9e0;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff9f0;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff9f8;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
  ctx_01._32_8_ = param_1;
  ctx_01.n.super_Tuple3<pbrt::Normal3,_float>._4_8_ = pCVar59;
  ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)param_2;
  ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)param_2 >> 0x20);
  ctx_01._56_8_ = in_stack_fffffffffffffa18;
  ctx_01.dvdx = (Float)in_stack_fffffffffffffa20;
  ctx_01.dvdy = (Float)in_stack_fffffffffffffa24;
  ctx_01.faceIndex = in_stack_fffffffffffffa28;
  local_ec = UniversalTextureEvaluator::operator()
                       (in_stack_fffffffffffff9d0,
                        (FloatTexture *)
                        CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),ctx_01);
  lVar16 = param_2 + 0x28;
  SampledWavelengths::operator[]((SampledWavelengths *)CONCAT44(uVar52,uVar50),(int)FVar54);
  local_14c = Spectrum::operator()((Spectrum *)CONCAT44(uVar52,uVar50),FVar54);
  bVar15 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           ::Is<pbrt::ConstantSpectrum>
                     ((TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                       *)CONCAT44(uVar52,uVar50));
  if (!bVar15) {
    SampledWavelengths::TerminateSecondary((SampledWavelengths *)CONCAT44(uVar52,uVar50));
  }
  if ((local_14c == 0.0) && (!NAN(local_14c))) {
    local_14c = 1.0;
  }
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x8f432b);
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x8f4338);
  bVar15 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(param_2 + 0x50));
  if (bVar15) {
    in_stack_fffffffffffff9e0 = local_190;
    SpectrumTexture::SpectrumTexture
              ((SpectrumTexture *)CONCAT44(uVar52,uVar50),(SpectrumTexture *)CONCAT44(FVar54,uVar48)
              );
    auVar18 = vmovdqu64_avx512f(*local_18);
    auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])(*local_18 + 0xc));
    auVar17 = vmovdqu64_avx512f(auVar17);
    auStack_1a8 = auVar17._52_12_;
    auVar17 = vmovdqu64_avx512f(auVar18);
    auStack_1e8 = auVar17._0_12_;
    local_1dc = auVar17._12_52_;
    local_208 = *local_20;
    uStack_200 = local_20[1];
    uStack_1f8 = local_20[2];
    uStack_1f0 = local_20[3];
    auVar18 = vmovdqu64_avx512f(auVar17);
    auVar11._52_12_ = auStack_1a8;
    auVar11._0_52_ = local_1dc;
    auVar19 = vmovdqu64_avx512f(auVar11);
    vmovdqu64_avx512f(auVar19);
    auVar17 = vmovdqu64_avx512f(auVar18);
    uVar48 = auVar17._0_4_;
    uVar50 = auVar17._4_4_;
    uVar52 = auVar17._8_4_;
    uVar53 = auVar17._12_4_;
    in_stack_fffffffffffff9e8 = &local_1;
    auVar33 = ZEXT856(auVar18._8_8_);
    auVar46 = ZEXT856(auVar19._8_8_);
    ctx_05.p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffa48.alpha_x;
    ctx_05.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffa48.alpha_y;
    ctx_05.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffa40;
    ctx_05.p.super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffa40 >> 0x20);
    ctx_05.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffa50;
    ctx_05.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = SUB84(in_stack_fffffffffffffa50,4);
    ctx_05.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa58;
    ctx_05.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = SUB84(in_stack_fffffffffffffa58,4);
    ctx_05.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffa60;
    ctx_05.n.super_Tuple3<pbrt::Normal3,_float>.x = SUB84(in_stack_fffffffffffffa60,4);
    ctx_05.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffa68;
    ctx_05.n.super_Tuple3<pbrt::Normal3,_float>.z = SUB84(in_stack_fffffffffffffa68,4);
    ctx_05.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffa70;
    ctx_05.uv.super_Tuple2<pbrt::Point2,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffa70 >> 0x20);
    ctx_05.dudx = (Float)in_stack_fffffffffffffa78;
    ctx_05.dudy = (Float)in_stack_fffffffffffffa7c;
    ctx_05.dvdx = SUB84(in_stack_fffffffffffffa7c,4);
    ctx_05.dvdy = in_stack_fffffffffffffa84;
    ctx_05.faceIndex = in_stack_fffffffffffffa88;
    auVar60 = in_stack_fffffffffffffa94._12_16_;
    lambda.lambda.values[1] = (float)in_stack_fffffffffffffa94._0_4_;
    lambda.lambda.values[2] = (float)in_stack_fffffffffffffa94._4_4_;
    lambda.lambda.values[3] = (float)in_stack_fffffffffffffa94._8_4_;
    lambda.pdf.values[0] = (float)auVar60._0_4_;
    lambda.pdf.values[1] = (float)auVar60._4_4_;
    lambda.pdf.values[2] = (float)auVar60._8_4_;
    lambda.pdf.values[3] = (float)auVar60._12_4_;
    lambda.lambda.values[0] = in_stack_fffffffffffffa90;
    SVar47 = UniversalTextureEvaluator::operator()
                       ((UniversalTextureEvaluator *)
                        CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                        in_stack_fffffffffffffa18,ctx_05,lambda);
    auVar34._0_8_ = SVar47.values.values._8_8_;
    auVar34._8_56_ = auVar46;
    auVar21._0_8_ = SVar47.values.values._0_8_;
    auVar21._8_56_ = auVar33;
    local_188 = vmovlpd_avx(auVar21._0_16_);
    uStack_180 = vmovlpd_avx(auVar34._0_16_);
    in_stack_fffffffffffff9f0 = local_220;
    local_168 = local_188;
    uStack_160 = uStack_180;
    SpectrumTexture::SpectrumTexture
              ((SpectrumTexture *)CONCAT44(uVar53,uVar52),(SpectrumTexture *)CONCAT44(uVar50,uVar48)
              );
    auVar18 = vmovdqu64_avx512f(*local_18);
    auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])(*local_18 + 0xc));
    auVar17 = vmovdqu64_avx512f(auVar17);
    auStack_238 = auVar17._52_12_;
    auVar17 = vmovdqu64_avx512f(auVar18);
    auStack_278 = auVar17._0_12_;
    local_26c = auVar17._12_52_;
    local_298 = *local_20;
    uStack_290 = local_20[1];
    uStack_288 = local_20[2];
    uStack_280 = local_20[3];
    auVar18 = vmovdqu64_avx512f(auVar17);
    auVar10._52_12_ = auStack_238;
    auVar10._0_52_ = local_26c;
    auVar19 = vmovdqu64_avx512f(auVar10);
    vmovdqu64_avx512f(auVar19);
    auVar17 = vmovdqu64_avx512f(auVar18);
    uVar48 = auVar17._0_4_;
    FVar54 = auVar17._4_4_;
    uVar50 = auVar17._8_4_;
    FVar20 = auVar17._12_4_;
    FVar55 = auVar17._20_4_;
    s = auVar17._24_8_;
    auVar33 = ZEXT856(auVar18._8_8_);
    auVar46 = ZEXT856(auVar19._8_8_);
    ctx_06.p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffa48.alpha_x;
    ctx_06.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffa48.alpha_y;
    ctx_06.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffa40;
    ctx_06.p.super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffa40 >> 0x20);
    ctx_06.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffa50;
    ctx_06.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = SUB84(in_stack_fffffffffffffa50,4);
    ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa58;
    ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = SUB84(in_stack_fffffffffffffa58,4);
    ctx_06.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffa60;
    ctx_06.n.super_Tuple3<pbrt::Normal3,_float>.x = SUB84(in_stack_fffffffffffffa60,4);
    ctx_06.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffa68;
    ctx_06.n.super_Tuple3<pbrt::Normal3,_float>.z = SUB84(in_stack_fffffffffffffa68,4);
    ctx_06.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffa70;
    ctx_06.uv.super_Tuple2<pbrt::Point2,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffa70 >> 0x20);
    ctx_06.dudx = (Float)in_stack_fffffffffffffa78;
    ctx_06.dudy = (Float)in_stack_fffffffffffffa7c;
    ctx_06.dvdx = SUB84(in_stack_fffffffffffffa7c,4);
    ctx_06.dvdy = in_stack_fffffffffffffa84;
    ctx_06.faceIndex = in_stack_fffffffffffffa88;
    auVar60 = in_stack_fffffffffffffa94._12_16_;
    lambda_00.lambda.values[1] = (float)in_stack_fffffffffffffa94._0_4_;
    lambda_00.lambda.values[2] = (float)in_stack_fffffffffffffa94._4_4_;
    lambda_00.lambda.values[3] = (float)in_stack_fffffffffffffa94._8_4_;
    lambda_00.pdf.values[0] = (float)auVar60._0_4_;
    lambda_00.pdf.values[1] = (float)auVar60._4_4_;
    lambda_00.pdf.values[2] = (float)auVar60._8_4_;
    lambda_00.pdf.values[3] = (float)auVar60._12_4_;
    lambda_00.lambda.values[0] = in_stack_fffffffffffffa90;
    SVar47 = UniversalTextureEvaluator::operator()
                       ((UniversalTextureEvaluator *)
                        CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                        in_stack_fffffffffffffa18,ctx_06,lambda_00);
    auVar35._0_8_ = SVar47.values.values._8_8_;
    auVar35._8_56_ = auVar46;
    auVar22._0_8_ = SVar47.values.values._0_8_;
    auVar22._8_56_ = auVar33;
    local_218 = vmovlpd_avx(auVar22._0_16_);
    local_210 = vmovlpd_avx(auVar35._0_16_);
    local_178 = local_218;
    uStack_170 = local_210;
  }
  else {
    in_stack_fffffffffffff9c0 = local_2c0;
    SpectrumTexture::SpectrumTexture
              ((SpectrumTexture *)CONCAT44(uVar52,uVar50),(SpectrumTexture *)CONCAT44(FVar54,uVar48)
              );
    auVar18 = vmovdqu64_avx512f(*local_18);
    auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])(*local_18 + 0xc));
    auVar17 = vmovdqu64_avx512f(auVar17);
    auStack_2d8 = auVar17._52_12_;
    auVar17 = vmovdqu64_avx512f(auVar18);
    auStack_318 = auVar17._0_12_;
    local_30c = auVar17._12_52_;
    local_338 = *local_20;
    uStack_330 = local_20[1];
    uStack_328 = local_20[2];
    uStack_320 = local_20[3];
    auVar18 = vmovdqu64_avx512f(auVar17);
    auVar9._52_12_ = auStack_2d8;
    auVar9._0_52_ = local_30c;
    auVar19 = vmovdqu64_avx512f(auVar9);
    vmovdqu64_avx512f(auVar19);
    auVar17 = vmovdqu64_avx512f(auVar18);
    uVar48 = auVar17._0_4_;
    FVar54 = auVar17._4_4_;
    uVar50 = auVar17._8_4_;
    FVar20 = auVar17._12_4_;
    uVar52 = auVar17._16_4_;
    FVar55 = auVar17._20_4_;
    s = auVar17._24_8_;
    auVar33 = ZEXT856(auVar18._8_8_);
    auVar46 = ZEXT856(auVar19._8_8_);
    ctx_07.p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffa48.alpha_x;
    ctx_07.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffa48.alpha_y;
    ctx_07.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffa40;
    ctx_07.p.super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffa40 >> 0x20);
    ctx_07.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffa50;
    ctx_07.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = SUB84(in_stack_fffffffffffffa50,4);
    ctx_07.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa58;
    ctx_07.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = SUB84(in_stack_fffffffffffffa58,4);
    ctx_07.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffa60;
    ctx_07.n.super_Tuple3<pbrt::Normal3,_float>.x = SUB84(in_stack_fffffffffffffa60,4);
    ctx_07.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffa68;
    ctx_07.n.super_Tuple3<pbrt::Normal3,_float>.z = SUB84(in_stack_fffffffffffffa68,4);
    ctx_07.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffa70;
    ctx_07.uv.super_Tuple2<pbrt::Point2,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffa70 >> 0x20);
    ctx_07.dudx = (Float)in_stack_fffffffffffffa78;
    ctx_07.dudy = (Float)in_stack_fffffffffffffa7c;
    ctx_07.dvdx = SUB84(in_stack_fffffffffffffa7c,4);
    ctx_07.dvdy = in_stack_fffffffffffffa84;
    ctx_07.faceIndex = in_stack_fffffffffffffa88;
    auVar60 = in_stack_fffffffffffffa94._12_16_;
    lambda_01.lambda.values[1] = (float)in_stack_fffffffffffffa94._0_4_;
    lambda_01.lambda.values[2] = (float)in_stack_fffffffffffffa94._4_4_;
    lambda_01.lambda.values[3] = (float)in_stack_fffffffffffffa94._8_4_;
    lambda_01.pdf.values[0] = (float)auVar60._0_4_;
    lambda_01.pdf.values[1] = (float)auVar60._4_4_;
    lambda_01.pdf.values[2] = (float)auVar60._8_4_;
    lambda_01.pdf.values[3] = (float)auVar60._12_4_;
    lambda_01.lambda.values[0] = in_stack_fffffffffffffa90;
    SVar47 = UniversalTextureEvaluator::operator()
                       ((UniversalTextureEvaluator *)
                        CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                        in_stack_fffffffffffffa18,ctx_07,lambda_01);
    auVar36._0_8_ = SVar47.values.values._8_8_;
    auVar36._8_56_ = auVar46;
    auVar23._0_8_ = SVar47.values.values._0_8_;
    auVar23._8_56_ = auVar33;
    local_2b8 = vmovlpd_avx(auVar23._0_16_);
    local_2b0 = vmovlpd_avx(auVar36._0_16_);
    auVar33 = ZEXT856(0);
    SVar47 = Clamp<int,double>(s,(int)FVar55,(double)CONCAT44(FVar20,uVar50));
    auVar37._0_8_ = SVar47.values.values._8_8_;
    auVar37._8_56_ = auVar46;
    auVar24._0_8_ = SVar47.values.values._0_8_;
    auVar24._8_56_ = auVar33;
    local_2a8 = vmovlpd_avx(auVar24._0_16_);
    local_2a0 = vmovlpd_avx(auVar37._0_16_);
    in_stack_fffffffffffff9cc = 0x3f800000;
    SampledSpectrum::SampledSpectrum((SampledSpectrum *)CONCAT44(FVar20,uVar50),FVar54);
    auVar33 = ZEXT856(uStack_340);
    local_168 = local_348;
    uStack_160 = uStack_340;
    SVar47 = Sqrt((SampledSpectrum *)CONCAT44(FVar20,uVar50));
    auVar38._0_8_ = SVar47.values.values._8_8_;
    auVar38._8_56_ = auVar46;
    auVar25._0_8_ = SVar47.values.values._0_8_;
    auVar25._8_56_ = auVar33;
    local_378 = vmovlpd_avx(auVar25._0_16_);
    local_370 = vmovlpd_avx(auVar38._0_16_);
    auVar33 = (undefined1  [56])0x0;
    SVar47 = pbrt::operator*(FVar20,(SampledSpectrum *)CONCAT44(FVar54,uVar48));
    auVar39._0_8_ = SVar47.values.values._8_8_;
    auVar39._8_56_ = auVar46;
    auVar26._0_8_ = SVar47.values.values._0_8_;
    auVar26._8_56_ = auVar33;
    auVar33 = (undefined1  [56])0x0;
    local_368 = vmovlpd_avx(auVar26._0_16_);
    local_360 = vmovlpd_avx(auVar39._0_16_);
    in_stack_fffffffffffff9d0 = local_3b8;
    SampledSpectrum::SampledSpectrum((SampledSpectrum *)CONCAT44(FVar20,uVar50),FVar54);
    SVar47 = SampledSpectrum::operator-
                       ((SampledSpectrum *)CONCAT44(FVar55,uVar52),
                        (SampledSpectrum *)CONCAT44(FVar20,uVar50));
    auVar40._0_8_ = SVar47.values.values._8_8_;
    auVar40._8_56_ = auVar46;
    auVar27._0_8_ = SVar47.values.values._0_8_;
    auVar27._8_56_ = auVar33;
    local_3a8 = vmovlpd_avx(auVar27._0_16_);
    local_3a0 = vmovlpd_avx(auVar40._0_16_);
    SVar47 = ClampZero((SampledSpectrum *)CONCAT44(FVar20,uVar50));
    auVar41._0_8_ = SVar47.values.values._8_8_;
    auVar41._8_56_ = auVar46;
    auVar28._0_8_ = SVar47.values.values._0_8_;
    auVar28._8_56_ = auVar33;
    local_398 = vmovlpd_avx(auVar28._0_16_);
    local_390 = vmovlpd_avx(auVar41._0_16_);
    SVar47 = Sqrt((SampledSpectrum *)CONCAT44(FVar20,uVar50));
    auVar42._0_8_ = SVar47.values.values._8_8_;
    auVar42._8_56_ = auVar46;
    auVar29._0_8_ = SVar47.values.values._0_8_;
    auVar29._8_56_ = auVar33;
    local_388 = vmovlpd_avx(auVar29._0_16_);
    local_380 = vmovlpd_avx(auVar42._0_16_);
    SVar47 = SampledSpectrum::operator/
                       ((SampledSpectrum *)CONCAT44(FVar55,uVar52),
                        (SampledSpectrum *)CONCAT44(FVar20,uVar50));
    auVar43._0_8_ = SVar47.values.values._8_8_;
    auVar43._8_56_ = auVar46;
    auVar30._0_8_ = SVar47.values.values._0_8_;
    auVar30._8_56_ = auVar33;
    local_358 = vmovlpd_avx(auVar30._0_16_);
    local_350 = vmovlpd_avx(auVar43._0_16_);
    local_178 = local_358;
    uStack_170 = local_350;
  }
  SampledSpectrum::operator/=(s,FVar55);
  SampledSpectrum::operator/=(s,FVar55);
  FloatTexture::FloatTexture
            ((FloatTexture *)CONCAT44(FVar20,uVar50),(FloatTexture *)CONCAT44(FVar54,uVar48));
  memcpy(local_418,local_18,0x4c);
  auVar7._12_52_ = auStack_40c;
  auVar7._0_12_ = local_418;
  auVar17 = vmovdqu64_avx512f(auVar7);
  auVar8._52_12_ = auStack_3d8;
  auVar8._0_52_ = auStack_40c;
  auVar18 = vmovdqu64_avx512f(auVar8);
  vmovdqu64_avx512f(auVar18);
  auVar17 = vmovdqu64_avx512f(auVar17);
  uVar48 = auVar17._0_4_;
  uVar50 = auVar17._4_4_;
  uVar52 = auVar17._8_4_;
  uVar53 = auVar17._12_4_;
  ctx_02._8_8_ = in_stack_fffffffffffff9e8;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffff9e0;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff9f0;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)lVar16;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)lVar16 >> 0x20);
  ctx_02._32_8_ = param_1;
  ctx_02.n.super_Tuple3<pbrt::Normal3,_float>._4_8_ = pCVar59;
  ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)param_2;
  ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)param_2 >> 0x20);
  ctx_02._56_8_ = in_stack_fffffffffffffa18;
  ctx_02.dvdx = (Float)in_stack_fffffffffffffa20;
  ctx_02.dvdy = (Float)in_stack_fffffffffffffa24;
  ctx_02.faceIndex = in_stack_fffffffffffffa28;
  local_3bc = UniversalTextureEvaluator::operator()
                        (in_stack_fffffffffffff9d0,
                         (FloatTexture *)
                         CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),ctx_02);
  FloatTexture::FloatTexture
            ((FloatTexture *)CONCAT44(uVar53,uVar52),(FloatTexture *)CONCAT44(uVar50,uVar48));
  memcpy(local_478,local_18,0x4c);
  auVar5._12_52_ = auStack_46c;
  auVar5._0_12_ = local_478;
  auVar17 = vmovdqu64_avx512f(auVar5);
  auVar6._52_12_ = auStack_438;
  auVar6._0_52_ = auStack_46c;
  auVar18 = vmovdqu64_avx512f(auVar6);
  vmovdqu64_avx512f(auVar18);
  auVar17 = vmovdqu64_avx512f(auVar17);
  uVar48 = auVar17._0_4_;
  uVar50 = auVar17._4_4_;
  uVar52 = auVar17._8_4_;
  uVar53 = auVar17._12_4_;
  FVar54 = auVar17._16_4_;
  FVar20 = auVar17._20_4_;
  pTVar56 = auVar17._24_8_;
  ctx_03._8_8_ = in_stack_fffffffffffff9e8;
  ctx_03.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffff9e0;
  ctx_03.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff9f0;
  ctx_03.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)lVar16;
  ctx_03.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)lVar16 >> 0x20);
  ctx_03._32_8_ = param_1;
  ctx_03.n.super_Tuple3<pbrt::Normal3,_float>._4_8_ = pCVar59;
  ctx_03.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)param_2;
  ctx_03.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)param_2 >> 0x20);
  ctx_03._56_8_ = in_stack_fffffffffffffa18;
  ctx_03.dvdx = (Float)in_stack_fffffffffffffa20;
  ctx_03.dvdy = (Float)in_stack_fffffffffffffa24;
  ctx_03.faceIndex = in_stack_fffffffffffffa28;
  local_41c = UniversalTextureEvaluator::operator()
                        (in_stack_fffffffffffff9d0,
                         (FloatTexture *)
                         CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),ctx_03);
  if ((*(byte *)(param_2 + 0x68) & 1) != 0) {
    local_3bc = TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
    local_41c = TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
  }
  mfDistrib = &local_480;
  TrowbridgeReitzDistribution::TrowbridgeReitzDistribution(pTVar56,FVar20,FVar54);
  puVar57 = local_4a8;
  SpectrumTexture::SpectrumTexture
            ((SpectrumTexture *)CONCAT44(uVar53,uVar52),(SpectrumTexture *)CONCAT44(uVar50,uVar48));
  auVar18 = vmovdqu64_avx512f(*local_18);
  auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])(*local_18 + 0xc));
  auVar17 = vmovdqu64_avx512f(auVar17);
  auStack_4b8 = auVar17._52_12_;
  auVar17 = vmovdqu64_avx512f(auVar18);
  local_4ec = auVar17._12_52_;
  FVar54 = (Float)((ulong)*local_20 >> 0x20);
  this = (CoatedConductorBxDF *)local_20[1];
  auVar18 = vmovdqu64_avx512f(auVar17);
  auVar4._52_12_ = auStack_4b8;
  auVar4._0_52_ = local_4ec;
  auVar19 = vmovdqu64_avx512f(auVar4);
  vmovdqu64_avx512f(auVar19);
  auVar17 = vmovdqu64_avx512f(auVar18);
  iVar49 = auVar17._0_4_;
  iVar51 = auVar17._4_4_;
  uVar48 = auVar17._8_4_;
  uVar50 = auVar17._12_4_;
  FVar58 = SUB84(&local_1,0);
  auVar33 = ZEXT856(auVar18._8_8_);
  auVar46 = ZEXT856(auVar19._8_8_);
  ctx_08.p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffa48.alpha_x;
  ctx_08.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffa48.alpha_y;
  ctx_08.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffa40;
  ctx_08.p.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffa40 >> 0x20);
  ctx_08.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffa50;
  ctx_08.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = SUB84(in_stack_fffffffffffffa50,4);
  ctx_08.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffa58;
  ctx_08.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = SUB84(in_stack_fffffffffffffa58,4);
  ctx_08.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffa60;
  ctx_08.n.super_Tuple3<pbrt::Normal3,_float>.x = SUB84(in_stack_fffffffffffffa60,4);
  ctx_08.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffa68;
  ctx_08.n.super_Tuple3<pbrt::Normal3,_float>.z = SUB84(in_stack_fffffffffffffa68,4);
  ctx_08.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffa70;
  ctx_08.uv.super_Tuple2<pbrt::Point2,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffffa70 >> 0x20);
  ctx_08.dudx = (Float)in_stack_fffffffffffffa78;
  ctx_08.dudy = (Float)in_stack_fffffffffffffa7c;
  ctx_08.dvdx = SUB84(in_stack_fffffffffffffa7c,4);
  ctx_08.dvdy = in_stack_fffffffffffffa84;
  ctx_08.faceIndex = in_stack_fffffffffffffa88;
  auVar60 = in_stack_fffffffffffffa94._12_16_;
  lambda_02.lambda.values[1] = (float)in_stack_fffffffffffffa94._0_4_;
  lambda_02.lambda.values[2] = (float)in_stack_fffffffffffffa94._4_4_;
  lambda_02.lambda.values[3] = (float)in_stack_fffffffffffffa94._8_4_;
  lambda_02.pdf.values[0] = (float)auVar60._0_4_;
  lambda_02.pdf.values[1] = (float)auVar60._4_4_;
  lambda_02.pdf.values[2] = (float)auVar60._8_4_;
  lambda_02.pdf.values[3] = (float)auVar60._12_4_;
  lambda_02.lambda.values[0] = in_stack_fffffffffffffa90;
  SVar47 = UniversalTextureEvaluator::operator()
                     ((UniversalTextureEvaluator *)
                      CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                      in_stack_fffffffffffffa18,ctx_08,lambda_02);
  auVar44._0_8_ = SVar47.values.values._8_8_;
  auVar44._8_56_ = auVar46;
  auVar31._0_8_ = SVar47.values.values._0_8_;
  auVar31._8_56_ = auVar33;
  local_4a0 = vmovlpd_avx(auVar31._0_16_);
  local_498 = vmovlpd_avx(auVar44._0_16_);
  high = 1;
  SVar47 = Clamp<int,int>((SampledSpectrum *)CONCAT44(uVar50,uVar48),iVar51,iVar49);
  auVar45._0_8_ = SVar47.values.values._8_8_;
  auVar45._8_56_ = auVar46;
  auVar32._0_8_ = SVar47.values.values._0_8_;
  auVar32._8_56_ = auVar33;
  local_490 = vmovlpd_avx(auVar32._0_16_);
  local_488 = vmovlpd_avx(auVar45._0_16_);
  FloatTexture::FloatTexture
            ((FloatTexture *)CONCAT44(uVar50,uVar48),(FloatTexture *)CONCAT44(iVar51,iVar49));
  auVar18 = vmovdqu64_avx512f(*local_18);
  auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])(*local_18 + 0xc));
  auVar17 = vmovdqu64_avx512f(auVar17);
  auStack_538 = auVar17._52_12_;
  auVar17 = vmovdqu64_avx512f(auVar18);
  auVar18 = vmovdqu64_avx512f(auVar17);
  auVar3._52_12_ = auStack_538;
  auVar3._0_52_ = auVar17._12_52_;
  auVar17 = vmovdqu64_avx512f(auVar3);
  auVar17 = vmovdqu64_avx512f(auVar17);
  iVar51 = auVar17._52_4_;
  FVar55 = auVar17._56_4_;
  uVar48 = auVar17._60_4_;
  auVar17 = vmovdqu64_avx512f(auVar18);
  iVar49 = auVar17._60_4_;
  ctx_04._8_8_ = in_stack_fffffffffffff9e8;
  ctx_04.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = in_stack_fffffffffffff9e0;
  ctx_04.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff9f0;
  ctx_04.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)lVar16;
  ctx_04.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)lVar16 >> 0x20);
  ctx_04._32_8_ = param_1;
  ctx_04.n.super_Tuple3<pbrt::Normal3,_float>._4_8_ = pCVar59;
  ctx_04.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)param_2;
  ctx_04.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)param_2 >> 0x20);
  ctx_04._56_8_ = in_stack_fffffffffffffa18;
  ctx_04.dvdx = (Float)in_stack_fffffffffffffa20;
  ctx_04.dvdy = (Float)in_stack_fffffffffffffa24;
  ctx_04.faceIndex = in_stack_fffffffffffffa28;
  FVar20 = UniversalTextureEvaluator::operator()
                     (in_stack_fffffffffffff9d0,
                      (FloatTexture *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                      ctx_04);
  Clamp<float,int,int>(FVar20,-1,high);
  DielectricBxDF::DielectricBxDF((DielectricBxDF *)&stack0xfffffffffffffa7c,local_14c,local_e8);
  eta.values.values[2] = (float)(undefined4)uStack_160;
  eta.values.values[3] = (float)uStack_160._4_4_;
  eta.values.values[0] = (float)(undefined4)local_168;
  eta.values.values[1] = (float)local_168._4_4_;
  SVar47.values.values[2] = (float)(undefined4)uStack_170;
  SVar47.values.values[3] = (float)uStack_170._4_4_;
  SVar47.values.values[0] = (float)(undefined4)local_178;
  SVar47.values.values[1] = (float)local_178._4_4_;
  ConductorBxDF::ConductorBxDF((ConductorBxDF *)&stack0xfffffffffffffa48,mfDistrib,eta,SVar47);
  DVar1.mfDistrib.alpha_y = FVar58;
  DVar1._0_8_ = puVar57;
  CVar2.mfDistrib.alpha_y = (Float)high;
  CVar2.mfDistrib.alpha_x = (Float)in_stack_fffffffffffff9b0;
  CVar2.eta.values.values._0_8_ = mfDistrib;
  CVar2.eta.values.values._8_8_ = in_stack_fffffffffffff9c0;
  CVar2.k.values.values[0] = (float)in_stack_fffffffffffff9c8;
  CVar2.k.values.values[1] = (float)in_stack_fffffffffffff9cc;
  CVar2.k.values.values._8_8_ = in_stack_fffffffffffff9d0;
  CoatedConductorBxDF::LayeredBxDF
            (this,DVar1,CVar2,FVar54,(SampledSpectrum *)CONCAT44(in_stack_fffffffffffff974,uVar48),
             FVar55,iVar51,iVar49);
  return pCVar59;
}

Assistant:

PBRT_CPU_GPU CoatedConductorBxDF CoatedConductorMaterial::GetBxDF(TextureEvaluator texEval,
                                                     const MaterialEvalContext &ctx,
                                                     SampledWavelengths &lambda) const {
    Float iurough = texEval(interfaceURoughness, ctx);
    Float ivrough = texEval(interfaceVRoughness, ctx);
    if (remapRoughness) {
        iurough = TrowbridgeReitzDistribution::RoughnessToAlpha(iurough);
        ivrough = TrowbridgeReitzDistribution::RoughnessToAlpha(ivrough);
    }
    TrowbridgeReitzDistribution interfaceDistrib(iurough, ivrough);

    Float thick = texEval(thickness, ctx);

    Float ieta = interfaceEta(lambda[0]);
    if (!interfaceEta.template Is<ConstantSpectrum>())
        lambda.TerminateSecondary();
    if (ieta == 0)
        ieta = 1;

    SampledSpectrum ce, ck;
    if (conductorEta) {
        ce = texEval(conductorEta, ctx, lambda);
        ck = texEval(k, ctx, lambda);
    } else {
        // Avoid r==1 NaN case...
        SampledSpectrum r = Clamp(texEval(reflectance, ctx, lambda), 0, .9999);
        ce = SampledSpectrum(1.f);
        ck = 2 * Sqrt(r) / Sqrt(ClampZero(SampledSpectrum(1) - r));
    }
    ce /= ieta;
    ck /= ieta;

    Float curough = texEval(conductorURoughness, ctx);
    Float cvrough = texEval(conductorVRoughness, ctx);
    if (remapRoughness) {
        curough = TrowbridgeReitzDistribution::RoughnessToAlpha(curough);
        cvrough = TrowbridgeReitzDistribution::RoughnessToAlpha(cvrough);
    }
    TrowbridgeReitzDistribution conductorDistrib(curough, cvrough);

    SampledSpectrum a = Clamp(texEval(albedo, ctx, lambda), 0, 1);
    Float gg = Clamp(texEval(g, ctx), -1, 1);

    return CoatedConductorBxDF(DielectricBxDF(ieta, interfaceDistrib),
                               ConductorBxDF(conductorDistrib, ce, ck), thick, a, gg,
                               maxDepth, nSamples);
}